

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O2

void dradf4(int ido,int l1,float *cc,float *ch,float *wa1,float *wa2,float *wa3)

{
  int iVar1;
  long lVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  float *pfVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  float *pfVar14;
  float *pfVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  int local_a4;
  float *local_a0;
  
  iVar1 = l1 * ido;
  local_a4 = ido * 2;
  lVar12 = (long)ido;
  lVar2 = (long)iVar1;
  if (l1 < 1) {
    l1 = 0;
  }
  iVar3 = ido * 4;
  pfVar4 = cc;
  iVar11 = 0;
  iVar8 = 0;
  iVar10 = l1;
  while (bVar16 = iVar10 != 0, iVar10 = iVar10 + -1, bVar16) {
    fVar17 = pfVar4[lVar2];
    fVar18 = pfVar4[iVar1 * 3];
    fVar21 = cc[iVar8];
    fVar24 = pfVar4[iVar1 * 2];
    ch[iVar11] = fVar17 + fVar18 + fVar21 + fVar24;
    ch[(long)(iVar3 + iVar11) + -1] = (fVar21 + fVar24) - (fVar17 + fVar18);
    ch[(long)(iVar11 + local_a4) + -1] = cc[iVar8] - pfVar4[iVar1 * 2];
    ch[iVar11 + local_a4] = pfVar4[iVar1 * 3] - pfVar4[lVar2];
    pfVar4 = pfVar4 + lVar12;
    iVar11 = iVar3 + iVar11;
    iVar8 = iVar8 + ido;
  }
  if (1 < ido) {
    if (ido == 2) {
      iVar3 = 8;
      lVar6 = 4;
    }
    else {
      lVar6 = (long)local_a4;
      pfVar4 = cc + lVar2;
      pfVar7 = cc + lVar2 * 3;
      pfVar14 = cc + lVar2 * 2;
      iVar10 = 0;
      pfVar5 = cc;
      for (iVar11 = 0; iVar11 != l1; iVar11 = iVar11 + 1) {
        lVar13 = (long)iVar10;
        pfVar15 = ch + (long)local_a4 + -3;
        for (lVar9 = 2; lVar9 < lVar12; lVar9 = lVar9 + 2) {
          fVar17 = wa3[lVar9 + -2] * pfVar7[lVar9 + -1] + wa3[lVar9 + -1] * pfVar7[lVar9];
          fVar18 = wa3[lVar9 + -2] * pfVar7[lVar9] - pfVar7[lVar9 + -1] * wa3[lVar9 + -1];
          fVar24 = pfVar14[lVar9 + -1] * wa2[lVar9 + -2] + pfVar14[lVar9] * wa2[lVar9 + -1];
          fVar25 = pfVar4[lVar9] * wa1[lVar9 + -2] + -wa1[lVar9 + -1] * pfVar4[lVar9 + -1];
          fVar20 = pfVar4[lVar9 + -1] * wa1[lVar9 + -2] + pfVar4[lVar9] * wa1[lVar9 + -1];
          fVar21 = pfVar14[lVar9] * wa2[lVar9 + -2] + -wa2[lVar9 + -1] * pfVar14[lVar9 + -1];
          fVar19 = fVar17 - fVar20;
          fVar22 = pfVar5[lVar9 + -1] + fVar24;
          fVar23 = fVar18 + fVar25;
          fVar24 = pfVar5[lVar9 + -1] - fVar24;
          fVar25 = fVar25 - fVar18;
          fVar17 = fVar17 + fVar20;
          fVar18 = pfVar5[lVar9] + fVar21;
          fVar21 = pfVar5[lVar9] - fVar21;
          *(ulong *)(ch + lVar13 + lVar9 + -1) = CONCAT44(fVar23 + fVar18,fVar22 + fVar17);
          *pfVar15 = fVar24 - fVar25;
          pfVar15[1] = fVar19 - fVar21;
          ch[lVar6 + lVar13 + lVar9 + -1] = fVar24 + fVar25;
          ch[lVar6 + lVar13 + lVar9] = fVar21 + fVar19;
          *(ulong *)(pfVar15 + lVar6) = CONCAT44(fVar23 - fVar18,fVar22 - fVar17);
          pfVar15 = pfVar15 + -2;
        }
        local_a4 = local_a4 + iVar3;
        iVar10 = iVar10 + iVar3;
        pfVar5 = pfVar5 + lVar12;
        pfVar4 = pfVar4 + lVar12;
        pfVar7 = pfVar7 + lVar12;
        pfVar14 = pfVar14 + lVar12;
      }
      if ((ido & 1U) != 0) {
        return;
      }
    }
    lVar13 = (long)(ido + iVar1 + -1);
    pfVar4 = ch + lVar12;
    pfVar14 = cc + ((ulong)(uint)ido - 1);
    local_a0 = cc;
    while (bVar16 = l1 != 0, l1 = l1 + -1, bVar16) {
      fVar18 = (local_a0[lVar13] + local_a0[iVar1 * 3 + -1 + ido]) * -0.70710677;
      fVar17 = (local_a0[lVar13] - local_a0[iVar1 * 3 + -1 + ido]) * 0.70710677;
      pfVar4[-1] = *pfVar14 + fVar17;
      pfVar4[lVar6 + -1] = *pfVar14 - fVar17;
      *pfVar4 = fVar18 - local_a0[lVar2 + lVar13];
      pfVar4[lVar6] = fVar18 + local_a0[lVar2 + lVar13];
      local_a0 = local_a0 + lVar12;
      pfVar4 = pfVar4 + iVar3;
      pfVar14 = pfVar14 + (uint)ido;
    }
  }
  return;
}

Assistant:

static void dradf4(int ido,int l1,float *cc,float *ch,float *wa1,
            float *wa2,float *wa3){
  static float hsqt2 = .70710678118654752f;
  int i,k,t0,t1,t2,t3,t4,t5,t6;
  float ci2,ci3,ci4,cr2,cr3,cr4,ti1,ti2,ti3,ti4,tr1,tr2,tr3,tr4;
  t0=l1*ido;

  t1=t0;
  t4=t1<<1;
  t2=t1+(t1<<1);
  t3=0;

  for(k=0;k<l1;k++){
    tr1=cc[t1]+cc[t2];
    tr2=cc[t3]+cc[t4];

    ch[t5=t3<<2]=tr1+tr2;
    ch[(ido<<2)+t5-1]=tr2-tr1;
    ch[(t5+=(ido<<1))-1]=cc[t3]-cc[t4];
    ch[t5]=cc[t2]-cc[t1];

    t1+=ido;
    t2+=ido;
    t3+=ido;
    t4+=ido;
  }

  if(ido<2)return;
  if(ido==2)goto L105;


  t1=0;
  for(k=0;k<l1;k++){
    t2=t1;
    t4=t1<<2;
    t5=(t6=ido<<1)+t4;
    for(i=2;i<ido;i+=2){
      t3=(t2+=2);
      t4+=2;
      t5-=2;

      t3+=t0;
      cr2=wa1[i-2]*cc[t3-1]+wa1[i-1]*cc[t3];
      ci2=wa1[i-2]*cc[t3]-wa1[i-1]*cc[t3-1];
      t3+=t0;
      cr3=wa2[i-2]*cc[t3-1]+wa2[i-1]*cc[t3];
      ci3=wa2[i-2]*cc[t3]-wa2[i-1]*cc[t3-1];
      t3+=t0;
      cr4=wa3[i-2]*cc[t3-1]+wa3[i-1]*cc[t3];
      ci4=wa3[i-2]*cc[t3]-wa3[i-1]*cc[t3-1];

      tr1=cr2+cr4;
      tr4=cr4-cr2;
      ti1=ci2+ci4;
      ti4=ci2-ci4;

      ti2=cc[t2]+ci3;
      ti3=cc[t2]-ci3;
      tr2=cc[t2-1]+cr3;
      tr3=cc[t2-1]-cr3;

      ch[t4-1]=tr1+tr2;
      ch[t4]=ti1+ti2;

      ch[t5-1]=tr3-ti4;
      ch[t5]=tr4-ti3;

      ch[t4+t6-1]=ti4+tr3;
      ch[t4+t6]=tr4+ti3;

      ch[t5+t6-1]=tr2-tr1;
      ch[t5+t6]=ti1-ti2;
    }
    t1+=ido;
  }
  if(ido&1)return;

 L105:

  t2=(t1=t0+ido-1)+(t0<<1);
  t3=ido<<2;
  t4=ido;
  t5=ido<<1;
  t6=ido;

  for(k=0;k<l1;k++){
    ti1=-hsqt2*(cc[t1]+cc[t2]);
    tr1=hsqt2*(cc[t1]-cc[t2]);

    ch[t4-1]=tr1+cc[t6-1];
    ch[t4+t5-1]=cc[t6-1]-tr1;

    ch[t4]=ti1-cc[t1+t0];
    ch[t4+t5]=ti1+cc[t1+t0];

    t1+=ido;
    t2+=ido;
    t4+=t3;
    t6+=ido;
  }
}